

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_22b6e::fillChannels(Rand48 *random,DeepImageLevel *level)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  int iVar11;
  float fVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  float fVar19;
  double dVar20;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"             sample counts ",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  iVar5 = *(int *)(level + 0x78);
  iVar11 = *(int *)(level + 0x74);
  lVar6 = Imf_3_4::SampleCountChannel::beginEdit();
  if (iVar5 * iVar11 != 0) {
    lVar16 = 0;
    do {
      lVar7 = Imath_3_2::nrand48(random->_state);
      *(int *)(lVar6 + lVar16 * 4) =
           (int)lVar7 +
           ((int)(SUB168(SEXT816(lVar7) * SEXT816(0x6666666666666667),8) >> 2) -
           (SUB164(SEXT816(lVar7) * SEXT816(0x6666666666666667),0xc) >> 0x1f)) * -10;
      lVar16 = lVar16 + 1;
    } while (iVar5 * iVar11 != lVar16);
  }
  Imf_3_4::SampleCountChannel::endEdit();
  p_Var8 = (_Rb_tree_node_base *)Imf_3_4::DeepImageLevel::begin();
  do {
    p_Var9 = (_Rb_tree_node_base *)Imf_3_4::DeepImageLevel::end();
    if (p_Var8 == p_Var9) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"             channel ",0x15);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    iVar5 = (**(code **)**(undefined8 **)(p_Var8 + 2))();
    if (iVar5 == 0) {
      lVar6 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                             &Imf_3_4::TypedDeepImageChannel<unsigned_int>::typeinfo,0);
      if (lVar6 == 0) goto LAB_0010c568;
      lVar16 = *(long *)(lVar6 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      iVar5 = *(int *)(lVar16 + 0x24);
      if (*(int *)(lVar16 + 0x1c) <= iVar5) {
        iVar11 = *(int *)(lVar16 + 0x20);
        iVar15 = *(int *)(lVar16 + 0x1c);
        do {
          iVar18 = *(int *)(lVar16 + 0x18);
          if (*(int *)(lVar16 + 0x18) <= iVar11) {
            do {
              Imf_3_4::ImageChannel::boundsCheck((int)lVar7 + 0x58,iVar18);
              lVar14 = (long)*(int *)(*(long *)(lVar7 + 0x90) +
                                     (long)(*(int *)(lVar7 + 0x74) * iVar15 + iVar18) * 4);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar6,iVar18);
              if (0 < lVar14) {
                lVar1 = *(long *)(*(long *)(lVar6 + 0x38) +
                                 (long)(*(int *)(lVar6 + 0x1c) * iVar15 + iVar18) * 8);
                lVar17 = 0;
                do {
                  dVar20 = (double)Imath_3_2::erand48(random->_state);
                  *(int *)(lVar1 + lVar17 * 4) = (int)(long)((1.0 - dVar20) * 0.0 + dVar20 * 100.0);
                  lVar17 = lVar17 + 1;
                } while (lVar14 != lVar17);
              }
              iVar11 = *(int *)(lVar16 + 0x20);
              bVar2 = iVar18 < iVar11;
              iVar18 = iVar18 + 1;
            } while (bVar2);
            iVar5 = *(int *)(lVar16 + 0x24);
          }
          bVar2 = iVar15 < iVar5;
          iVar15 = iVar15 + 1;
        } while (bVar2);
      }
    }
    else if (iVar5 == 2) {
      lVar6 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                             &Imf_3_4::TypedDeepImageChannel<float>::typeinfo,0);
      if (lVar6 == 0) goto LAB_0010c568;
      lVar16 = *(long *)(lVar6 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      iVar5 = *(int *)(lVar16 + 0x24);
      if (*(int *)(lVar16 + 0x1c) <= iVar5) {
        iVar11 = *(int *)(lVar16 + 0x20);
        iVar15 = *(int *)(lVar16 + 0x1c);
        do {
          iVar18 = *(int *)(lVar16 + 0x18);
          if (*(int *)(lVar16 + 0x18) <= iVar11) {
            do {
              Imf_3_4::ImageChannel::boundsCheck((int)lVar7 + 0x58,iVar18);
              lVar14 = (long)*(int *)(*(long *)(lVar7 + 0x90) +
                                     (long)(*(int *)(lVar7 + 0x74) * iVar15 + iVar18) * 4);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar6,iVar18);
              if (0 < lVar14) {
                lVar1 = *(long *)(*(long *)(lVar6 + 0x38) +
                                 (long)(*(int *)(lVar6 + 0x1c) * iVar15 + iVar18) * 8);
                lVar17 = 0;
                do {
                  dVar20 = (double)Imath_3_2::erand48(random->_state);
                  *(float *)(lVar1 + lVar17 * 4) = (float)((1.0 - dVar20) * 0.0 + dVar20 * 100.0);
                  lVar17 = lVar17 + 1;
                } while (lVar14 != lVar17);
              }
              iVar11 = *(int *)(lVar16 + 0x20);
              bVar2 = iVar18 < iVar11;
              iVar18 = iVar18 + 1;
            } while (bVar2);
            iVar5 = *(int *)(lVar16 + 0x24);
          }
          bVar2 = iVar15 < iVar5;
          iVar15 = iVar15 + 1;
        } while (bVar2);
      }
    }
    else {
      if (iVar5 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                      ,0xed,"void (anonymous namespace)::fillChannels(Rand48 &, DeepImageLevel &)");
      }
      lVar6 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::DeepImageChannel::typeinfo,
                             &Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::typeinfo,0);
      if (lVar6 == 0) {
LAB_0010c568:
        __cxa_bad_cast();
      }
      lVar16 = *(long *)(lVar6 + 8);
      lVar7 = Imf_3_4::DeepImageChannel::deepLevel();
      iVar5 = *(int *)(lVar16 + 0x24);
      if (*(int *)(lVar16 + 0x1c) <= iVar5) {
        iVar11 = *(int *)(lVar16 + 0x20);
        iVar15 = *(int *)(lVar16 + 0x1c);
        do {
          iVar18 = *(int *)(lVar16 + 0x18);
          if (*(int *)(lVar16 + 0x18) <= iVar11) {
            do {
              Imf_3_4::ImageChannel::boundsCheck((int)lVar7 + 0x58,iVar18);
              lVar14 = (long)*(int *)(*(long *)(lVar7 + 0x90) +
                                     (long)(*(int *)(lVar7 + 0x74) * iVar15 + iVar18) * 4);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar6,iVar18);
              if (0 < lVar14) {
                lVar1 = *(long *)(*(long *)(lVar6 + 0x38) +
                                 (long)(*(int *)(lVar6 + 0x1c) * iVar15 + iVar18) * 8);
                lVar17 = 0;
                do {
                  dVar20 = (double)Imath_3_2::erand48(random->_state);
                  fVar19 = (float)((1.0 - dVar20) * 0.0 + dVar20 * 100.0);
                  fVar12 = ABS(fVar19);
                  uVar4 = (ushort)((uint)fVar19 >> 0x10) & 0x8000;
                  if ((uint)fVar12 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar12) &&
                       (uVar13 = (uint)fVar12 & 0x7fffff | 0x800000,
                       cVar3 = (char)((uint)fVar12 >> 0x17),
                       uVar4 = uVar4 | (ushort)(uVar13 >> (0x7eU - cVar3 & 0x1f)),
                       0x80000000 < uVar13 << (cVar3 + 0xa2U & 0x1f))) {
                      uVar4 = uVar4 + 1;
                    }
                  }
                  else if ((uint)fVar12 < 0x7f800000) {
                    if ((uint)fVar12 < 0x477ff000) {
                      uVar4 = (ushort)((int)fVar12 + 0x8000fff +
                                       (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd) | uVar4;
                    }
                    else {
                      uVar4 = uVar4 | 0x7c00;
                    }
                  }
                  else {
                    uVar4 = uVar4 | 0x7c00;
                    if (fVar12 != INFINITY) {
                      uVar13 = (uint)fVar12 >> 0xd & 0x3ff;
                      uVar4 = uVar4 | (ushort)uVar13 | (ushort)(uVar13 == 0);
                    }
                  }
                  *(ushort *)(lVar1 + lVar17 * 2) = uVar4;
                  lVar17 = lVar17 + 1;
                } while (lVar14 != lVar17);
              }
              iVar11 = *(int *)(lVar16 + 0x20);
              bVar2 = iVar18 < iVar11;
              iVar18 = iVar18 + 1;
            } while (bVar2);
            iVar5 = *(int *)(lVar16 + 0x24);
          }
          bVar2 = iVar15 < iVar5;
          iVar15 = iVar15 + 1;
        } while (bVar2);
      }
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void
fillChannels (Rand48& random, DeepImageLevel& level)
{
    cout << "             sample counts " << endl;
    fillSampleCounts (random, level.sampleCounts ());

    for (DeepImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}